

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

Matrix_t Companion_Mat4(Matrix_t sMatrix)

{
  ulong uVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  ulong uVar5;
  undefined8 uVar6;
  ulong uVar7;
  float *pfVar8;
  float *pfVar9;
  ulong uVar10;
  float *pfVar11;
  ulong uVar12;
  float fVar13;
  Matrix_t sMatrix_00;
  Matrix_t MVar14;
  float arr [3] [3];
  float local_68 [2];
  float *local_60;
  float local_58 [10];
  
  local_60 = (float *)malloc(0x40);
  if (local_60 == (float *)0x0) {
    printf("ERROR: Malloc failed!-03");
  }
  else {
    if ((sMatrix._8_4_ & 0xffff) == 0x404) {
      uVar12 = 0;
      do {
        pfVar2 = local_60;
        uVar7 = 0;
        do {
          uVar5 = 0;
          pfVar3 = local_68;
          pfVar4 = sMatrix.pMatrix;
          do {
            uVar10 = 0;
            pfVar8 = pfVar3;
            pfVar9 = pfVar4;
            do {
              if (uVar7 != uVar10 && uVar5 != uVar12) {
                if (uVar10 < uVar7) {
                  uVar1 = uVar10;
                  if (uVar5 < uVar12) {
LAB_0010b070:
                    pfVar11 = local_58 + uVar1 * 3 + uVar5;
                  }
                  else {
                    pfVar11 = local_58 + uVar10 * 3 + (uVar5 - 1);
                  }
                }
                else {
                  pfVar11 = pfVar8;
                  if (uVar5 < uVar12) {
                    uVar1 = uVar10 - 1;
                    goto LAB_0010b070;
                  }
                }
                *pfVar11 = *pfVar9;
              }
              uVar10 = uVar10 + 1;
              pfVar9 = pfVar9 + 4;
              pfVar8 = pfVar8 + 3;
            } while (uVar10 != 4);
            uVar5 = uVar5 + 1;
            pfVar4 = pfVar4 + 1;
            pfVar3 = pfVar3 + 1;
          } while (uVar5 != 4);
          sMatrix_00.row = '\x03';
          sMatrix_00.column = '\x03';
          sMatrix_00._10_6_ = 0;
          sMatrix_00.pMatrix = local_58;
          fVar13 = Det3(sMatrix_00);
          if (((int)uVar7 + (int)uVar12 & 1U) != 0) {
            fVar13 = -fVar13;
          }
          pfVar2[uVar12 * 4 + uVar7] = fVar13;
          uVar7 = uVar7 + 1;
        } while (uVar7 != 4);
        uVar12 = uVar12 + 1;
      } while (uVar12 != 4);
      uVar6 = 0x404;
      goto LAB_0010b118;
    }
    puts("ERROR: Cannot calculate determinant, matrix must be a 4x4 square matrix!");
  }
  local_60 = (float *)0x0;
  uVar6 = 0;
LAB_0010b118:
  MVar14.row = (char)uVar6;
  MVar14.column = (char)((ulong)uVar6 >> 8);
  MVar14._10_6_ = (int6)((ulong)uVar6 >> 0x10);
  MVar14.pMatrix = local_60;
  return MVar14;
}

Assistant:

Matrix_t Companion_Mat4(Matrix_t sMatrix) //严格意义上讲矩阵是没有代数余子式的，代数余子式属于行列式|A|的元素aij，而非矩阵元素aij
{
	float arr[3][3];
	float *arr_res;
	int i, j, x, y;
	Matrix_t mat_err = {NULL, 0, 0};
	arr_res = (float *)malloc(sizeof(float) * 4 * 4);
	if (arr_res == NULL)
	{
		printf("ERROR: Malloc failed!-03");
		return mat_err;
	}
	if (sMatrix.row == 4 && sMatrix.column == 4) //伴随矩阵用于求矩阵的逆，矩阵有逆的必要条件是矩阵是个方阵
	{
		for (i = 0; i < 4; i++)
		{
			for (j = 0; j < 4; j++)
			{
				for (x = 0; x < 4; x++)
				{
					for (y = 0; y < 4; y++)
					{
						if (x != i)
						{
							if (y != j)
							{
								if (y < j) //选出矩阵的余子式
								{
									if (x < i)
										arr[y][x] = *(sMatrix.pMatrix + y * sMatrix.column + x);
									else
										arr[y][x - 1] = *(sMatrix.pMatrix + y * sMatrix.column + x);
								}
								else
								{
									if (x < i)
										arr[y - 1][x] = *(sMatrix.pMatrix + y * sMatrix.column + x);
									else
										arr[y - 1][x - 1] = *(sMatrix.pMatrix + y * sMatrix.column + x);
								}
							}
						}
					}
				}
				if ((i + j) % 2 == 0) //计算代数余子式的值并将值存放在结果伴随矩阵的相应位置
					*(arr_res + i * 4 + j) = Det3(Arr2Mat(arr[0], 3, 3));
				else
					*(arr_res + i * 4 + j) = (-1) * Det3(Arr2Mat(arr[0], 3, 3));
			}
		}
		return Arr2Mat(arr_res, 4, 4);
	}
	else
	{
		printf("ERROR: Cannot calculate determinant, matrix must be a 4x4 square matrix!\n");
		return mat_err;
	}
}